

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O3

void duckdb::
     HistogramUpdateFunction<duckdb::HistogramFunctor,int,duckdb::DefaultMapType<std::unordered_map<int,unsigned_long,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,unsigned_long>>>>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  long *plVar1;
  ulong uVar2;
  _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this;
  mapped_type *pmVar3;
  ulong uVar4;
  ulong uVar5;
  UnifiedVectorFormat input_data;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(inputs,count,&local_c0);
  if (count != 0) {
    uVar4 = 0;
    do {
      uVar5 = uVar4;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)(local_c0.sel)->sel_vector[uVar4];
      }
      if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6] >>
           (uVar5 & 0x3f) & 1) != 0)) {
        uVar2 = uVar4;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar2 = (ulong)(local_78.sel)->sel_vector[uVar4];
        }
        plVar1 = *(long **)(local_78.data + uVar2 * 8);
        this = (_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)*plVar1;
        if (this == (_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)0x0) {
          this = (_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)operator_new(0x38);
          *(undefined8 *)(this + 0x20) = 0;
          *(undefined8 *)(this + 0x28) = 0;
          *(_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            **)this = this + 0x30;
          *(undefined8 *)(this + 8) = 1;
          *(undefined8 *)(this + 0x10) = 0;
          *(undefined8 *)(this + 0x18) = 0;
          *(undefined4 *)(this + 0x20) = 0x3f800000;
          *(undefined8 *)(this + 0x28) = 0;
          *(undefined8 *)(this + 0x30) = 0;
          *plVar1 = (long)this;
        }
        pmVar3 = ::std::__detail::
                 _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](this,(key_type *)(local_c0.data + uVar5 * 4));
        *pmVar3 = *pmVar3 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (count != uVar4);
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void HistogramUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                    Vector &state_vector, idx_t count) {

	D_ASSERT(input_count == 1);

	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, typename MAP_TYPE::MAP_TYPE> *>(sdata);
	auto input_values = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			state.hist = MAP_TYPE::CreateEmpty(aggr_input.allocator);
		}
		auto &input_value = input_values[idx];
		++(*state.hist)[input_value];
	}
}